

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseStringEntityRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *pxStack_30;
  xmlChar cur;
  xmlChar *ptr;
  xmlChar *name;
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((str == (xmlChar **)0x0) || (*str == (xmlChar *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (**str == '&') {
    pxStack_30 = *str + 1;
    name = (xmlChar *)str;
    str_local = (xmlChar **)ctxt;
    ptr = xmlParseStringName(ctxt,&stack0xffffffffffffffd0);
    if ((xmlParserCtxtPtr)ptr == (xmlParserCtxtPtr)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)str_local,XML_ERR_NAME_REQUIRED,
                     "xmlParseStringEntityRef: no name\n");
      *(xmlChar **)name = pxStack_30;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (*pxStack_30 == ';') {
      *(xmlChar **)name = pxStack_30 + 1;
      ctxt_local = (xmlParserCtxtPtr)ptr;
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)str_local,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      (*xmlFree)(ptr);
      *(xmlChar **)name = pxStack_30;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
xmlParseStringEntityRef(xmlParserCtxtPtr ctxt, const xmlChar ** str) {
    xmlChar *name;
    const xmlChar *ptr;
    xmlChar cur;

    if ((str == NULL) || (*str == NULL))
        return(NULL);
    ptr = *str;
    cur = *ptr;
    if (cur != '&')
	return(NULL);

    ptr++;
    name = xmlParseStringName(ctxt, &ptr);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseStringEntityRef: no name\n");
	*str = ptr;
	return(NULL);
    }
    if (*ptr != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
        xmlFree(name);
	*str = ptr;
	return(NULL);
    }
    ptr++;

    *str = ptr;
    return(name);
}